

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

string * __thiscall
compiler::AssemblerCompiler::do_const_abi_cxx11_
          (string *__return_storage_ptr__,AssemblerCompiler *this,Const *constant)

{
  Const *constant_local;
  AssemblerCompiler *this_local;
  
  std::__cxx11::to_string(__return_storage_ptr__,constant->value);
  return __return_storage_ptr__;
}

Assistant:

std::string AssemblerCompiler::do_const(const Const *constant) {
    return std::to_string(constant->value);
}